

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

longdouble * __thiscall
baryonyx::itm::compute_delta<long_double,baryonyx::itm::quadratic_cost_type<long_double>>
          (longdouble *__return_storage_ptr__,itm *this,context *ctx,
          quadratic_cost_type<long_double> *c,longdouble theta,int n)

{
  longdouble *extraout_RAX;
  longdouble in_ST0;
  longdouble local_48;
  longdouble local_38;
  longdouble local_28;
  
  local_28 = theta;
  info<>((context *)__return_storage_ptr__,"  - delta not defined, compute it:\n");
  quadratic_cost_type<long_double>::min((quadratic_cost_type<long_double> *)this,(int)ctx);
  local_48 = in_ST0 - theta * in_ST0;
  info<long_double,long_double,long_double>
            ((context *)__return_storage_ptr__,
             "    - delta={} (min normalized cost:{} / theta: {})\n",&local_48,&local_38,&local_28);
  return extraout_RAX;
}

Assistant:

inline Float
compute_delta(const context& ctx, const Cost& c, Float theta, int n)
{
    info(ctx, "  - delta not defined, compute it:\n");

    const auto mini = c.min(n);
    const auto ret = mini - theta * mini;

    info(ctx,
         "    - delta={} (min normalized cost:{} / theta: {})\n",
         ret,
         mini,
         theta);

    return ret;
}